

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_StringCharStarLength_Test::
TestBody(GeneratedMessageTest_StringCharStarLength_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *arena;
  string *psVar3;
  char *pcVar4;
  AssertHelper local_408;
  Message local_400;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_3;
  Message local_3e0;
  undefined1 local_3d8 [8];
  AssertionResult gtest_ar_2;
  Message local_3c0;
  int local_3b8 [2];
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_1;
  Message local_398;
  undefined1 local_390 [8];
  AssertionResult gtest_ar;
  undefined1 local_370 [8];
  TestAllTypes message;
  GeneratedMessageTest_StringCharStarLength_Test *this_local;
  
  message.field_0._808_8_ = this;
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_370);
  puVar2 = protobuf::internal::HasBits<2>::operator[]
                     ((HasBits<2> *)&message.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arena = protobuf::MessageLite::GetArena((MessageLite *)local_370);
  protobuf::internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &message.field_0._impl_.repeated_lazy_message_.super_RepeatedPtrFieldBase.arena_,
             "abcdef",3,arena);
  psVar3 = proto2_unittest::TestAllTypes::optional_string_abi_cxx11_((TestAllTypes *)local_370);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_390,"\"abc\"","message.optional_string()",(char (*) [4])"abc",psVar3)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_390);
  if (!bVar1) {
    testing::Message::Message(&local_398);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x16d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_390);
  proto2_unittest::TestAllTypes::add_repeated_string<char_const(&)[7],int>
            ((TestAllTypes *)local_370,(char (*) [7])0x212de33,3);
  local_3b8[1] = 1;
  local_3b8[0] = proto2_unittest::TestAllTypes::repeated_string_size((TestAllTypes *)local_370);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_3b0,"1","message.repeated_string_size()",local_3b8 + 1,local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x171,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_3c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
  psVar3 = proto2_unittest::TestAllTypes::repeated_string_abi_cxx11_((TestAllTypes *)local_370,0);
  testing::internal::EqHelper::
  Compare<char[4],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3d8,"\"abc\"","message.repeated_string(0)",(char (*) [4])"abc",psVar3
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d8);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x172,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d8);
  proto2_unittest::TestAllTypes::set_repeated_string<char_const(&)[5],int>
            ((TestAllTypes *)local_370,0,(char (*) [5])"wxyz",2);
  psVar3 = proto2_unittest::TestAllTypes::repeated_string_abi_cxx11_((TestAllTypes *)local_370,0);
  testing::internal::EqHelper::
  Compare<char[3],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_3f8,"\"wx\"","message.repeated_string(0)",(char (*) [3])"wx",psVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_400);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/unittest.inc"
               ,0x176,pcVar4);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_370);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, StringCharStarLength) {
  // Verify that we can use a char*,length to set one of the string fields.
  UNITTEST::TestAllTypes message;
  message.set_optional_string("abcdef", 3);
  EXPECT_EQ("abc", message.optional_string());

  // Verify that we can use a char*,length to add to a repeated string field.
  message.add_repeated_string("abcdef", 3);
  EXPECT_EQ(1, message.repeated_string_size());
  EXPECT_EQ("abc", message.repeated_string(0));

  // Verify that we can use a char*,length to set a repeated string field.
  message.set_repeated_string(0, "wxyz", 2);
  EXPECT_EQ("wx", message.repeated_string(0));
}